

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O0

void __thiscall
sznet::MinHeap<sznet::Timer>::shiftUp_(MinHeap<sznet::Timer> *this,uint32_t hole_index,Timer *e)

{
  int iVar1;
  bool bVar2;
  uint local_24;
  uint32_t parent_index;
  Timer *e_local;
  uint32_t hole_index_local;
  MinHeap<sznet::Timer> *this_local;
  
  local_24 = parent(this,hole_index);
  e_local._4_4_ = hole_index;
  while( true ) {
    bVar2 = false;
    if (e_local._4_4_ != 0) {
      iVar1 = (*this->m_pCmpFunc)(this->m_ptrArr[local_24],e);
      bVar2 = iVar1 == 1;
    }
    if (!bVar2) break;
    this->m_ptrArr[e_local._4_4_] = this->m_ptrArr[local_24];
    (this->m_ptrArr[e_local._4_4_]->super_MinHeaBaseElem).min_heap_idx = e_local._4_4_;
    e_local._4_4_ = local_24;
    local_24 = parent(this,local_24);
  }
  this->m_ptrArr[e_local._4_4_] = e;
  (this->m_ptrArr[e_local._4_4_]->super_MinHeaBaseElem).min_heap_idx = e_local._4_4_;
  return;
}

Assistant:

void shiftUp_(uint32_t hole_index, T* e)
	{
		uint32_t parent_index = parent(hole_index);
		// 循环向上给e找个适合的位置
		while ((hole_index > 0) && m_pCmpFunc(m_ptrArr[parent_index], e) == 1)
		{
			m_ptrArr[hole_index] = m_ptrArr[parent_index];
			m_ptrArr[hole_index]->min_heap_idx = hole_index;
			hole_index = parent_index;
			parent_index = parent(hole_index);
		}
		m_ptrArr[hole_index] = e;
		m_ptrArr[hole_index]->min_heap_idx = hole_index;
	}